

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalGenerators.cpp
# Opt level: O0

void __thiscall
helics::apps::RampGenerator::set(RampGenerator *this,string_view parameter,double val)

{
  string_view sVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  bool bVar2;
  char *in_RDX;
  char *in_RSI;
  SignalGenerator *in_RDI;
  _func_int **in_XMM0_Qa;
  char *in_stack_ffffffffffffff98;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  char *pcVar3;
  size_t in_stack_ffffffffffffffb8;
  char *pcVar4;
  char *in_stack_ffffffffffffffc0;
  
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  __x._M_str = in_stack_ffffffffffffffc0;
  __x._M_len = in_stack_ffffffffffffffb8;
  __y._M_str = in_stack_ffffffffffffffb0;
  __y._M_len = in_stack_ffffffffffffffa8;
  bVar2 = std::operator==(__x,__y);
  if (bVar2) {
    in_RDI[1]._vptr_SignalGenerator = in_XMM0_Qa;
    bVar2 = TimeRepresentation<count_time<9,_long>_>::operator>(&in_RDI->lastTime,&in_RDI->keyTime);
    if (bVar2) {
      (in_RDI->keyTime).internalTimeCode = (in_RDI->lastTime).internalTimeCode;
    }
  }
  else {
    pcVar3 = in_RSI;
    pcVar4 = in_RDX;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    __x_00._M_str = in_stack_ffffffffffffffc0;
    __x_00._M_len = (size_t)pcVar4;
    __y_00._M_str = pcVar3;
    __y_00._M_len = in_stack_ffffffffffffffa8;
    bVar2 = std::operator==(__x_00,__y_00);
    if (bVar2) {
      in_RDI[1].lastTime.internalTimeCode = (baseType)in_XMM0_Qa;
      bVar2 = TimeRepresentation<count_time<9,_long>_>::operator>
                        (&in_RDI->lastTime,&in_RDI->keyTime);
      if (bVar2) {
        (in_RDI->keyTime).internalTimeCode = (in_RDI->lastTime).internalTimeCode;
      }
    }
    else {
      sVar1._M_str = in_RDX;
      sVar1._M_len = (size_t)in_RSI;
      SignalGenerator::set(in_RDI,sVar1,(double)in_XMM0_Qa);
    }
  }
  return;
}

Assistant:

void RampGenerator::set(std::string_view parameter, double val)
    {
        if (parameter == "level") {
            level = val;
            if (lastTime > keyTime) {
                keyTime = lastTime;
            }
        } else if (parameter == "ramp") {
            ramp = val;
            if (lastTime > keyTime) {
                keyTime = lastTime;
            }
        } else {
            SignalGenerator::set(parameter, val);
        }
    }